

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments *app)

{
  bool bVar1;
  MyDocument *pMVar2;
  int doc_n;
  int i;
  
  for (i = 0; i < ShowExampleAppDocuments(bool*)::app; i = i + 1) {
    pMVar2 = ImVector<MyDocument>::operator[]
                       ((ImVector<MyDocument> *)&ShowExampleAppDocuments(bool*)::app,i);
    bVar1 = pMVar2->Open;
    if ((bVar1 == false) && (pMVar2->OpenPrev == true)) {
      ImGui::SetTabItemClosed(pMVar2->Name);
      bVar1 = pMVar2->Open;
    }
    pMVar2->OpenPrev = bVar1;
  }
  return;
}

Assistant:

static void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments& app)
{
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (!doc->Open && doc->OpenPrev)
            ImGui::SetTabItemClosed(doc->Name);
        doc->OpenPrev = doc->Open;
    }
}